

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall
soplex::DataArray<soplex::SPxSolverBase<double>::VarStatus>::reMax
          (DataArray<soplex::SPxSolverBase<double>::VarStatus> *this,int newMax,int newSize)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_stack_0000002c;
  VarStatus **in_stack_00000030;
  int in_stack_0000003c;
  VarStatus **in_stack_00000040;
  int local_c;
  
  if (-1 < in_EDX) {
    *in_RDI = in_EDX;
  }
  local_c = in_ESI;
  if (in_ESI < in_EDX) {
    local_c = in_EDX;
  }
  if (local_c < 1) {
    local_c = 1;
  }
  if (local_c != in_RDI[1]) {
    in_RDI[1] = local_c;
    if (*in_RDI < 1) {
      spx_free<soplex::SPxSolverBase<double>::VarStatus*>((VarStatus **)0x27a228);
      spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(in_stack_00000030,in_stack_0000002c);
    }
    else {
      spx_realloc<soplex::SPxSolverBase<double>::VarStatus*>(in_stack_00000040,in_stack_0000003c);
    }
  }
  return;
}

Assistant:

void reMax(int newMax = 1, int newSize = -1)
   {
      if(newSize >= 0)
         thesize = newSize;

      if(newMax < newSize)
         newMax = newSize;

      if(newMax < 1)
         newMax = 1;

      if(newMax == themax)
         return;

      themax = newMax;

      if(thesize <= 0)
      {
         /* no data needs to be copied so do a clean free and alloc */
         spx_free(data);
         spx_alloc(data, themax);
      }
      else
         spx_realloc(data, themax);
   }